

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolve.hpp
# Opt level: O2

Status __thiscall
soplex::SPxSolverBase<double>::getDualSol(SPxSolverBase<double> *this,VectorBase<double> *p_vector)

{
  Status *pSVar1;
  pointer pdVar2;
  UpdateVector<double> *pUVar3;
  DataKey DVar4;
  int iVar5;
  Status SVar6;
  SPxStatusException *this_00;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  double dVar10;
  DataKey local_60;
  double local_58;
  string local_50;
  
  if (this->initialized != false) {
    if (this->theRep == ROW) {
      VectorBase<double>::operator=
                (p_vector,&(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.object);
      for (uVar7 = (ulong)(uint)(this->super_SPxLPBase<double>).super_LPColSetBase<double>.
                                super_SVSetBase<double>.set.thenum; 0 < (int)uVar7;
          uVar7 = uVar7 - 1) {
        DVar4 = (this->super_SPxBasisBase<double>).theBaseId.data[uVar7 - 1].super_DataKey;
        if (DVar4.info < 0) {
          local_58 = (this->theFvec->super_VectorBase<double>).val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar7 + 0xffffffffffffffff];
          local_60 = DVar4;
          SPxRowId::SPxRowId((SPxRowId *)&local_50,(SPxId *)&local_60);
          iVar5 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                            (&(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                              super_SVSetBase<double>.set,(DataKey *)&local_50);
          (p_vector->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[iVar5] = local_58;
        }
      }
    }
    else {
      uVar9 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set
              .thenum;
      pSVar1 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data;
      pdVar2 = (p_vector->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pUVar3 = this->theCoPvec;
      uVar8 = 0;
      uVar7 = (ulong)uVar9;
      if ((int)uVar9 < 1) {
        uVar7 = uVar8;
      }
      for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
        uVar9 = pSVar1[uVar8] + P_FREE;
        if ((7 < uVar9) || (dVar10 = 0.0, (0xabU >> (uVar9 & 0x1f) & 1) == 0)) {
          dVar10 = (pUVar3->super_VectorBase<double>).val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar8];
        }
        pdVar2[uVar8] = dVar10;
      }
    }
    local_50._M_dataplus._M_p = (pointer)(double)(this->super_SPxLPBase<double>).thesense;
    VectorBase<double>::operator*=(p_vector,(double *)&local_50);
    SVar6 = status(this);
    return SVar6;
  }
  SVar6 = status(this);
  if (SVar6 != NO_PROBLEM) {
    this_00 = (SPxStatusException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&local_50,"XSOLVE08 No Problem loaded",(allocator *)&local_60);
    SPxStatusException::SPxStatusException(this_00,&local_50);
    __cxa_throw(this_00,&SPxStatusException::typeinfo,SPxException::~SPxException);
  }
  SVar6 = status(this);
  return SVar6;
}

Assistant:

typename SPxSolverBase<R>::Status SPxSolverBase<R>::getDualSol(VectorBase<R>& p_vector) const
{

   assert(isInitialized());

   if(!isInitialized())
   {
      /* exit if presolving/simplifier cleared the problem */
      if(status() == NO_PROBLEM)
         return status();

      throw SPxStatusException("XSOLVE08 No Problem loaded");
   }

   if(rep() == ROW)
   {
      int i;
      p_vector = this->maxRowObj();

      for(i = this->nCols() - 1; i >= 0; --i)
      {
         if(this->baseId(i).isSPxRowId())
            p_vector[ this->number(SPxRowId(this->baseId(i))) ] = fVec()[i];
      }
   }
   else
   {
      const typename SPxBasisBase<R>::Desc& ds = this->desc();

      for(int i = 0; i < this->nRows(); ++i)
      {
         switch(ds.rowStatus(i))
         {
         case SPxBasisBase<R>::Desc::D_FREE:
         case SPxBasisBase<R>::Desc::D_ON_UPPER:
         case SPxBasisBase<R>::Desc::D_ON_LOWER:
         case SPxBasisBase<R>::Desc::D_ON_BOTH:
         case SPxBasisBase<R>::Desc::D_UNDEFINED:
            p_vector[i] = 0;
            break;

         default:
            p_vector[i] = (*theCoPvec)[i];
         }
      }
   }

   p_vector *= Real(this->spxSense());

   return status();
}